

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void QtPromisePrivate::PromiseDispatch<int>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,std::function<int(double_const&)>,double_const&>
               (QPromiseResolve<int> *resolve,QPromiseReject<int> *reject,
               function<int_(const_double_&)> *fn,double *args)

{
  undefined8 uVar1;
  exception_ptr local_20;
  int local_14;
  
  if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar1 = std::__throw_bad_function_call();
    __cxa_begin_catch(uVar1);
    std::current_exception();
    PromiseResolver<int>::reject<std::__exception_ptr::exception_ptr>(&reject->m_resolver,&local_20)
    ;
    call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,std::function<int(double_const&)>,double_const&>
              ((PromiseDispatch<int> *)&local_20);
  }
  else {
    local_14 = (*fn->_M_invoker)((_Any_data *)fn,args);
    PromiseResolver<int>::resolve<int>(&resolve->m_resolver,&local_14);
  }
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }